

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MultiIterNext(Fts5Index *p,Fts5Iter *pIter,int bFrom,i64 iFrom)

{
  int iVar1;
  Fts5SegIter *local_40;
  Fts5SegIter *pSeg;
  uint local_30;
  int bNewTerm;
  int iFirst;
  int bUseFrom;
  i64 iFrom_local;
  Fts5Iter *pFStack_18;
  int bFrom_local;
  Fts5Iter *pIter_local;
  Fts5Index *p_local;
  
  bNewTerm = bFrom;
  _iFirst = iFrom;
  iFrom_local._4_4_ = bFrom;
  pFStack_18 = pIter;
  pIter_local = (Fts5Iter *)p;
  while( true ) {
    if (*(int *)((long)&pIter_local->pColset + 4) != 0) {
      return;
    }
    local_30 = (uint)pFStack_18->aFirst[1].iFirst;
    pSeg._4_4_ = 0;
    local_40 = pFStack_18->aSeg + (int)local_30;
    if ((bNewTerm == 0) || (local_40->pDlidx == (Fts5DlidxIter *)0x0)) {
      (*local_40->xNext)((Fts5Index *)pIter_local,local_40,(int *)((long)&pSeg + 4));
    }
    else {
      fts5SegIterNextFrom((Fts5Index *)pIter_local,local_40,_iFirst);
    }
    if (((local_40->pLeaf == (Fts5Data *)0x0) || (pSeg._4_4_ != 0)) ||
       (iVar1 = fts5MultiIterAdvanceRowid(pFStack_18,local_30,&local_40), iVar1 != 0)) {
      fts5MultiIterAdvanced((Fts5Index *)pIter_local,pFStack_18,local_30,1);
      fts5MultiIterSetEof(pFStack_18);
      local_40 = pFStack_18->aSeg + pFStack_18->aFirst[1].iFirst;
      if (local_40->pLeaf == (Fts5Data *)0x0) {
        return;
      }
    }
    if ((pFStack_18->bSkipEmpty == '\0') || (local_40->nPos != 0)) break;
    bNewTerm = 0;
  }
  (*pFStack_18->xSetOutputs)(pFStack_18,local_40);
  return;
}

Assistant:

static void fts5MultiIterNext(
  Fts5Index *p, 
  Fts5Iter *pIter,
  int bFrom,                      /* True if argument iFrom is valid */
  i64 iFrom                       /* Advance at least as far as this */
){
  int bUseFrom = bFrom;
  assert( pIter->base.bEof==0 );
  while( p->rc==SQLITE_OK ){
    int iFirst = pIter->aFirst[1].iFirst;
    int bNewTerm = 0;
    Fts5SegIter *pSeg = &pIter->aSeg[iFirst];
    assert( p->rc==SQLITE_OK );
    if( bUseFrom && pSeg->pDlidx ){
      fts5SegIterNextFrom(p, pSeg, iFrom);
    }else{
      pSeg->xNext(p, pSeg, &bNewTerm);
    }

    if( pSeg->pLeaf==0 || bNewTerm 
     || fts5MultiIterAdvanceRowid(pIter, iFirst, &pSeg)
    ){
      fts5MultiIterAdvanced(p, pIter, iFirst, 1);
      fts5MultiIterSetEof(pIter);
      pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
      if( pSeg->pLeaf==0 ) return;
    }

    fts5AssertMultiIterSetup(p, pIter);
    assert( pSeg==&pIter->aSeg[pIter->aFirst[1].iFirst] && pSeg->pLeaf );
    if( pIter->bSkipEmpty==0 || pSeg->nPos ){
      pIter->xSetOutputs(pIter, pSeg);
      return;
    }
    bUseFrom = 0;
  }
}